

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
          (ArenaVectorBase<ArenaVector<bool>,bool> *this,vector<bool,_std::allocator<bool>_> *list)

{
  bool bVar1;
  const_reference cVar2;
  size_type size_00;
  const_iterator cVar3;
  const_reference elem;
  undefined1 local_60 [8];
  const_iterator __end0;
  undefined1 local_40 [8];
  const_iterator __begin0;
  vector<bool,_std::allocator<bool>_> *__range2;
  size_t i;
  size_t size;
  vector<bool,_std::allocator<bool>_> *list_local;
  ArenaVectorBase<ArenaVector<bool>,_bool> *this_local;
  
  size_00 = std::vector<bool,_std::allocator<bool>_>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<bool>::allocate((ArenaVector<bool> *)this,size_00);
  }
  __range2 = (vector<bool,_std::allocator<bool>_> *)0x0;
  __begin0.super__Bit_iterator_base._8_8_ = list;
  cVar3 = std::vector<bool,_std::allocator<bool>_>::begin(list);
  __end0.super__Bit_iterator_base._8_8_ = cVar3.super__Bit_iterator_base._M_p;
  __begin0.super__Bit_iterator_base._M_p._0_4_ = cVar3.super__Bit_iterator_base._M_offset;
  local_40 = (undefined1  [8])__end0.super__Bit_iterator_base._8_8_;
  cVar3 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)__begin0.super__Bit_iterator_base._8_8_)
  ;
  local_60 = (undefined1  [8])cVar3.super__Bit_iterator_base._M_p;
  __end0.super__Bit_iterator_base._M_p._0_4_ = cVar3.super__Bit_iterator_base._M_offset;
  while( true ) {
    bVar1 = std::operator!=((_Bit_iterator_base *)local_40,(_Bit_iterator_base *)local_60);
    if (!bVar1) break;
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_40);
    *(const_reference *)
     ((long)&(__range2->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p + *(long *)this) = cVar2;
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_40);
    __range2 = (vector<bool,_std::allocator<bool>_> *)
               ((long)&(__range2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  *(size_type *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }